

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  int64_t iVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  JSValueUnion JVar6;
  JSValueUnion p2;
  uint end;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong idx;
  ulong uVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  uint32_t lim;
  undefined4 uStack_54;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
  }
  else {
    JVar15 = *argv;
    JVar14 = *argv;
    JVar6 = argv[1].u;
    iVar2 = argv[1].tag;
    JVar16 = argv[1];
    uVar10 = (uint)argv->tag;
    if ((uVar10 & 0xfffffffe) != 2) {
      JVar13 = JS_GetPropertyInternal(ctx,*argv,0xcb,*argv,0);
      if (1 < (int)JVar13.tag - 2U) {
        if ((int)JVar13.tag != 6) {
          _lim = this_val.u;
          local_50 = this_val.tag;
          local_48 = JVar6;
          local_40 = iVar2;
          JVar13 = JS_CallFree(ctx,JVar13,JVar14,2,(JSValue *)&lim);
          uVar12 = (ulong)JVar13.u.ptr >> 0x20;
          goto LAB_001581ba;
        }
        goto LAB_001581b7;
      }
    }
    JVar14 = JS_ToString(ctx,this_val);
    JVar6 = JVar14.u;
    if ((int)JVar14.tag == 6) {
      JVar13 = (JSValue)(ZEXT816(3) << 0x40);
      uVar12 = 0;
LAB_00157ee7:
      uVar7 = 0;
      JVar15 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      JVar13 = JS_NewArray(ctx);
      uVar12 = (ulong)JVar13.u.ptr >> 0x20;
      if ((int)JVar13.tag == 6) goto LAB_00157ee7;
      if ((int)iVar2 == 3) {
        lim = 0xffffffff;
LAB_00157f6c:
        uVar3 = *(undefined8 *)((long)JVar6.ptr + 4);
        JVar15 = JS_ToString(ctx,JVar15);
        p2 = JVar15.u;
        uVar7 = (ulong)p2.ptr >> 0x20;
        if ((int)JVar15.tag != 6) {
          uVar8 = (ulong)_lim & 0xffffffff;
          if (uVar8 != 0) {
            end = (uint)uVar3 & 0x7fffffff;
            if (uVar10 == 3) {
LAB_00157fd7:
              lVar11 = 0;
              idx = 0;
LAB_00157fdd:
              JVar16 = js_sub_string(ctx,(JSString *)JVar6.ptr,(int)lVar11,end);
              if (((int)JVar16.tag == 6) ||
                 (iVar5 = JS_CreateDataPropertyUint32(ctx,JVar13,idx,JVar16,0), iVar5 < 0))
              goto LAB_0015817b;
            }
            else {
              uVar9 = (ulong)((uint)*(undefined8 *)((long)p2.ptr + 4) & 0x7fffffff);
              if ((ulong)end == 0) {
                if (uVar9 != 0) goto LAB_00157fd7;
              }
              else {
                idx = 0;
                lVar11 = 0;
                do {
                  lVar1 = lVar11 + (ulong)(uVar9 == 0);
                  if (((long)((end - uVar9) - (ulong)(uVar9 == 0)) < lVar1) ||
                     (iVar5 = string_indexof((JSString *)JVar6.ptr,(JSString *)p2.ptr,(int)lVar1),
                     iVar5 < 0)) goto LAB_00157fdd;
                  JVar16 = js_sub_string(ctx,(JSString *)JVar6.ptr,(int)lVar11,iVar5);
                  if (((int)JVar16.tag == 6) ||
                     (iVar4 = JS_CreateDataPropertyUint32(ctx,JVar13,idx,JVar16,0), iVar4 < 0))
                  goto LAB_0015817b;
                  idx = idx + 1;
                  lVar11 = (long)iVar5 + uVar9;
                } while (uVar8 != idx);
              }
            }
          }
          JS_FreeValue(ctx,JVar14);
          JS_FreeValue(ctx,JVar15);
          goto LAB_001581ba;
        }
      }
      else {
        iVar5 = JS_ToInt32(ctx,(int32_t *)&lim,JVar16);
        if (-1 < iVar5) goto LAB_00157f6c;
        uVar7 = 0;
        JVar15 = (JSValue)(ZEXT816(3) << 0x40);
      }
    }
LAB_0015817b:
    JVar16.tag = JVar13.tag;
    JVar16.u.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar12 << 0x20);
    JS_FreeValue(ctx,JVar16);
    JS_FreeValue(ctx,JVar14);
    JVar14.u.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar7 << 0x20);
    JVar14.tag = JVar15.tag;
    JS_FreeValue(ctx,JVar14);
  }
LAB_001581b7:
  JVar13 = (JSValue)(ZEXT816(6) << 0x40);
  uVar12 = 0;
LAB_001581ba:
  JVar15.tag = JVar13.tag;
  JVar15.u.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar12 << 0x20);
  return JVar15;
}

Assistant:

static JSValue js_string_split(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    // split(sep, limit)
    JSValueConst O = this_val, separator = argv[0], limit = argv[1];
    JSValueConst args[2];
    JSValue S, A, R, T;
    uint32_t lim, lengthA;
    int64_t p, q, s, r, e;
    JSString *sp, *rp;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    S = JS_UNDEFINED;
    A = JS_UNDEFINED;
    R = JS_UNDEFINED;

    if (!JS_IsUndefined(separator) && !JS_IsNull(separator)) {
        JSValue splitter;
        splitter = JS_GetProperty(ctx, separator, JS_ATOM_Symbol_split);
        if (JS_IsException(splitter))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(splitter) && !JS_IsNull(splitter)) {
            args[0] = O;
            args[1] = limit;
            return JS_CallFree(ctx, splitter, separator, 2, args);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(limit)) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, limit) < 0)
            goto exception;
    }
    sp = JS_VALUE_GET_STRING(S);
    s = sp->len;
    R = JS_ToString(ctx, separator);
    if (JS_IsException(R))
        goto exception;
    rp = JS_VALUE_GET_STRING(R);
    r = rp->len;
    p = 0;
    if (lim == 0)
        goto done;
    if (JS_IsUndefined(separator))
        goto add_tail;
    if (s == 0) {
        if (r != 0)
            goto add_tail;
        goto done;
    }
    q = p;
    for (q = p; (q += !r) <= s - r - !r; q = p = e + r) {
        e = string_indexof(sp, rp, q);
        if (e < 0)
            break;
        T = js_sub_string(ctx, sp, p, e);
        if (JS_IsException(T))
            goto exception;
        if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T, 0) < 0)
            goto exception;
        if (lengthA == lim)
            goto done;
    }
add_tail:
    T = js_sub_string(ctx, sp, p, s);
    if (JS_IsException(T))
        goto exception;
    if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T,0 ) < 0)
        goto exception;
done:
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return JS_EXCEPTION;
}